

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O2

XSWildcard * __thiscall
xercesc_4_0::XSObjectFactory::createXSWildcard
          (XSObjectFactory *this,SchemaAttDef *attDef,XSModel *xsModel)

{
  XSAnnotation *annot;
  XSWildcard *this_00;
  SchemaAttDef *key;
  
  key = attDef->fBaseAttDecl;
  if (attDef->fBaseAttDecl == (SchemaAttDef *)0x0) {
    key = attDef;
  }
  annot = getAnnotationFromModel(this,xsModel,key);
  this_00 = (XSWildcard *)XMemory::operator_new(0x40,this->fMemoryManager);
  XSWildcard::XSWildcard(this_00,attDef,annot,xsModel,this->fMemoryManager);
  BaseRefVectorOf<xercesc_4_0::XSObject>::addElement
            (&this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>,(XSObject *)this_00)
  ;
  return this_00;
}

Assistant:

XSWildcard*
XSObjectFactory::createXSWildcard(SchemaAttDef* const attDef,
                                  XSModel* const xsModel)
{
    XSAnnotation* annot = (attDef->getBaseAttDecl())
        ? getAnnotationFromModel(xsModel, attDef->getBaseAttDecl())
        : getAnnotationFromModel(xsModel, attDef);

    XSWildcard* xsWildcard = new (fMemoryManager) XSWildcard
    (
        attDef
        , annot
        , xsModel
        , fMemoryManager
    );
    fDeleteVector->addElement(xsWildcard);

    return xsWildcard;
}